

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_object.cc
# Opt level: O2

ASN1_OBJECT * ASN1_OBJECT_new(void)

{
  ASN1_OBJECT *pAVar1;
  
  pAVar1 = (ASN1_OBJECT *)OPENSSL_malloc(0x28);
  if (pAVar1 != (ASN1_OBJECT *)0x0) {
    pAVar1->nid = 0;
    pAVar1->length = 0;
    pAVar1->data = (uchar *)0x0;
    pAVar1->sn = (char *)0x0;
    pAVar1->ln = (char **)0x0;
    pAVar1->flags = 1;
  }
  return pAVar1;
}

Assistant:

ASN1_OBJECT *ASN1_OBJECT_new(void) {
  ASN1_OBJECT *ret;

  ret = (ASN1_OBJECT *)OPENSSL_malloc(sizeof(ASN1_OBJECT));
  if (ret == NULL) {
    return NULL;
  }
  ret->length = 0;
  ret->data = NULL;
  ret->nid = 0;
  ret->sn = NULL;
  ret->ln = NULL;
  ret->flags = ASN1_OBJECT_FLAG_DYNAMIC;
  return ret;
}